

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlator.cc
# Opt level: O0

int decoder::correlate(uint8_t *data,size_t len,int *maxOut,correlationType *maxType)

{
  uint uVar1;
  int iVar2;
  uint *in_RCX;
  int *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint i_1;
  int j;
  int v;
  uint j_1;
  uint i;
  int max [4];
  int pos [4];
  uint64_t tmp;
  uint local_5c;
  uint local_58;
  uint local_50;
  uint local_4c;
  int local_48 [4];
  int local_38 [4];
  ulong local_28;
  uint *local_20;
  int *local_18;
  ulong local_10;
  long local_8;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_38,0,0x10);
  memset(local_48,0,0x10);
  for (local_4c = 0; local_4c < local_10; local_4c = local_4c + 1) {
    local_28 = local_28 << 1 | (long)((int)(*(byte *)(local_8 + (ulong)local_4c) & 0x80) >> 7);
    if (0x3e < local_4c) {
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        uVar1 = (uint)local_28 ^
                (uint)*(undefined8 *)((anonymous_namespace)::encodedSyncWords + (ulong)local_50 * 8)
        ;
        uVar1 = uVar1 - (uVar1 >> 1 & 0x55555555);
        uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
        iVar2 = 0x40 - ((uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18);
        if (local_48[local_50] < iVar2) {
          local_48[local_50] = iVar2;
          local_38[local_50] = local_4c - 0x3f;
        }
      }
    }
  }
  local_58 = 0;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    if (local_48[(int)local_58] < local_48[local_5c]) {
      local_58 = local_5c;
    }
  }
  if (local_18 != (int *)0x0) {
    *local_18 = local_48[(int)local_58];
  }
  if (local_20 != (uint *)0x0) {
    *local_20 = local_58;
  }
  return local_38[(int)local_58];
}

Assistant:

int correlate(uint8_t* data, size_t len, int* maxOut, correlationType* maxType) {
  uint64_t tmp = 0;

  // Position with maximum correlation
  int pos[4] = { 0, 0, 0, 0 };

  // Maximum correlation
  int max[4] = { 0, 0, 0, 0 };

  // Find maximum correlation
  for (unsigned i = 0; i < len; i++) {
    // If data >= 128 (i.e. MSB == 1), set bit in stream.
    tmp = (tmp << 1) | (data[i] & 0x80) >> 7;
    if (i < (encodedSyncWordBits - 1)) {
      continue;
    }

    // Match tmp against encoded sync words
    for (unsigned j = 0; j < 4; j++) {
      auto v = 64 - __builtin_popcount(tmp ^ encodedSyncWords[j]);
      if (v > max[j]) {
        max[j] = v;
        pos[j] = i - (encodedSyncWordBits - 1);
      }
    }
  }

  // Return position for best correlating sync word
  int j = 0;
  for (unsigned i = 0; i < 4; i++) {
    if (max[i] > max[j]) {
      j = i;
    }
  }

  if (maxOut != nullptr) {
    *maxOut = max[j];
  }
  if (maxType != nullptr) {
    *maxType = static_cast<correlationType>(j);
  }
  return pos[j];
}